

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_is_device_name_in_hw_format__alsa(char *hwid)

{
  char *pcVar1;
  int local_2c;
  int i;
  char *dev;
  char *pcStack_18;
  int commaPos;
  char *hwid_local;
  
  if (hwid == (char *)0x0) {
    hwid_local._4_4_ = 0;
  }
  else if (((*hwid == 'h') && (hwid[1] == 'w')) && (hwid[2] == ':')) {
    pcStack_18 = hwid + 3;
    pcVar1 = ma_find_char(pcStack_18,',',(int *)((long)&dev + 4));
    if (pcVar1 == (char *)0x0) {
      hwid_local._4_4_ = 0;
    }
    else {
      for (local_2c = 0; local_2c < dev._4_4_; local_2c = local_2c + 1) {
        if ((pcStack_18[local_2c] < '0') || ('9' < pcStack_18[local_2c])) {
          return 0;
        }
      }
      local_2c = 0;
      while (pcVar1[(long)local_2c + 1] != '\0') {
        if ((pcVar1[(long)local_2c + 1] < '0') || ('9' < pcVar1[(long)local_2c + 1])) {
          return 0;
        }
        local_2c = local_2c + 1;
      }
      hwid_local._4_4_ = 1;
    }
  }
  else {
    hwid_local._4_4_ = 0;
  }
  return hwid_local._4_4_;
}

Assistant:

static ma_bool32 ma_is_device_name_in_hw_format__alsa(const char* hwid)
{
    /* This function is just checking whether or not hwid is in "hw:%d,%d" format. */

    int commaPos;
    const char* dev;
    int i;

    if (hwid == NULL) {
        return MA_FALSE;
    }

    if (hwid[0] != 'h' || hwid[1] != 'w' || hwid[2] != ':') {
        return MA_FALSE;
    }

    hwid += 3;

    dev = ma_find_char(hwid, ',', &commaPos);
    if (dev == NULL) {
        return MA_FALSE;
    } else {
        dev += 1;   /* Skip past the ",". */
    }

    /* Check if the part between the ":" and the "," contains only numbers. If not, return false. */
    for (i = 0; i < commaPos; ++i) {
        if (hwid[i] < '0' || hwid[i] > '9') {
            return MA_FALSE;
        }
    }

    /* Check if everything after the "," is numeric. If not, return false. */
    i = 0;
    while (dev[i] != '\0') {
        if (dev[i] < '0' || dev[i] > '9') {
            return MA_FALSE;
        }
        i += 1;
    }

    return MA_TRUE;
}